

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

bool __thiscall
DependencyScan::RecomputeOutputsDirty
          (DependencyScan *this,Edge *edge,Node *most_recent_input,bool *outputs_dirty,string *err)

{
  bool bVar1;
  pointer ppNVar2;
  string command;
  string local_50;
  
  Edge::EvaluateCommand_abi_cxx11_(&local_50,edge,true);
  ppNVar2 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar2 !=
      (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      bVar1 = RecomputeOutputDirty(this,edge,most_recent_input,&local_50,*ppNVar2);
      if (bVar1) {
        *outputs_dirty = true;
        break;
      }
      ppNVar2 = ppNVar2 + 1;
    } while (ppNVar2 !=
             (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool DependencyScan::RecomputeOutputsDirty(Edge* edge, Node* most_recent_input,
                                           bool* outputs_dirty, string* err) {
  string command = edge->EvaluateCommand(/*incl_rsp_file=*/true);
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (RecomputeOutputDirty(edge, most_recent_input, command, *o)) {
      *outputs_dirty = true;
      return true;
    }
  }
  return true;
}